

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bitmask<slang::ast::IntegralFlags> __thiscall slang::ast::Type::getIntegralFlags(Type *this)

{
  bool bVar1;
  IntegralType *pIVar2;
  IntegralType *in_RDI;
  IntegralType *it;
  bitmask<slang::ast::IntegralFlags> flags;
  Type *in_stack_ffffffffffffffe0;
  bitmask<slang::ast::IntegralFlags> local_1;
  
  bitmask<slang::ast::IntegralFlags>::bitmask(&local_1);
  bVar1 = isIntegral(in_stack_ffffffffffffffe0);
  if (bVar1) {
    getCanonicalType(in_stack_ffffffffffffffe0);
    pIVar2 = Symbol::as<slang::ast::IntegralType>((Symbol *)0x56312f);
    if ((pIVar2->isSigned & 1U) != 0) {
      bitmask<slang::ast::IntegralFlags>::bitmask
                ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe7,Signed);
      bitmask<slang::ast::IntegralFlags>::operator|=
                (&local_1,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe7);
    }
    if ((pIVar2->isFourState & 1U) != 0) {
      bitmask<slang::ast::IntegralFlags>::bitmask
                ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe6,FourState);
      bitmask<slang::ast::IntegralFlags>::operator|=
                (&local_1,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe6);
    }
    bVar1 = IntegralType::isDeclaredReg(in_RDI);
    if (bVar1) {
      bitmask<slang::ast::IntegralFlags>::bitmask
                ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe5,Reg);
      bitmask<slang::ast::IntegralFlags>::operator|=
                (&local_1,(bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffe5);
    }
  }
  return (bitmask<slang::ast::IntegralFlags>)local_1.m_bits;
}

Assistant:

bitmask<IntegralFlags> Type::getIntegralFlags() const {
    bitmask<IntegralFlags> flags;
    if (!isIntegral())
        return flags;

    const IntegralType& it = getCanonicalType().as<IntegralType>();
    if (it.isSigned)
        flags |= IntegralFlags::Signed;
    if (it.isFourState)
        flags |= IntegralFlags::FourState;
    if (it.isDeclaredReg())
        flags |= IntegralFlags::Reg;

    return flags;
}